

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileSystemComboBox.cpp
# Opt level: O0

void QFileSystemComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  Section *pSVar3;
  bool bVar4;
  Filters FVar5;
  Section SVar6;
  QFileSystemComboBox *pQVar7;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  void *_v_1;
  QFileSystemComboBox *_t_2;
  void *_v;
  QFileSystemComboBox *_t_1;
  int *result;
  QString _r_1;
  QString _r;
  QFileSystemComboBox *_t;
  undefined4 in_stack_fffffffffffffef8;
  Section in_stack_fffffffffffffefc;
  QList<QString> *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  QFileSystemComboBox *in_stack_ffffffffffffff38;
  QFileSystemComboBox *in_stack_ffffffffffffff40;
  QFileSystemComboBox *in_stack_ffffffffffffff48;
  QFileSystemComboBox *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffffd8;
  QFileSystemComboBox *in_stack_ffffffffffffffe0;
  
  if (in_ESI == 0) {
    pQVar7 = (QFileSystemComboBox *)(ulong)in_EDX;
    switch(pQVar7) {
    case (QFileSystemComboBox *)0x0:
      directoryLoaded(pQVar7,in_stack_ffffffffffffff08);
      break;
    case (QFileSystemComboBox *)0x1:
      rootPathChanged(pQVar7,in_stack_ffffffffffffff08);
      break;
    case (QFileSystemComboBox *)0x2:
      currentFileNameChanged(in_stack_ffffffffffffff48,(QString *)in_stack_ffffffffffffff40);
      if (*in_RCX != 0) {
        QString::operator=((QString *)in_stack_ffffffffffffff00,
                           (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
        ;
      }
      QString::~QString((QString *)0x1d887e);
      break;
    case (QFileSystemComboBox *)0x3:
      currentFilePathChanged(in_stack_ffffffffffffff48,(QString *)in_stack_ffffffffffffff40);
      if (*in_RCX != 0) {
        QString::operator=((QString *)in_stack_ffffffffffffff00,
                           (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
        ;
      }
      QString::~QString((QString *)0x1d88d4);
    }
  }
  else if (in_ESI == 5) {
    puVar1 = (undefined4 *)*in_RCX;
    pcVar2 = *(code **)in_RCX[1];
    if (pcVar2 == directoryLoaded && (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *(code **)in_RCX[1];
      if (pcVar2 == rootPathChanged && (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *(code **)in_RCX[1];
        if (pcVar2 == currentFileNameChanged &&
            (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *(code **)in_RCX[1];
          if (pcVar2 == currentFilePathChanged &&
              (pcVar2 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
            *puVar1 = 3;
          }
        }
      }
    }
  }
  else if (in_ESI == 1) {
    pSVar3 = (Section *)*in_RCX;
    switch(in_EDX) {
    case 0:
      bVar4 = nameFilterDisables((QFileSystemComboBox *)0x1d8a98);
      *(bool *)pSVar3 = bVar4;
      break;
    case 1:
      bVar4 = resolveSymlinks((QFileSystemComboBox *)0x1d8ab9);
      *(bool *)pSVar3 = bVar4;
      break;
    case 2:
      FVar5 = filters((QFileSystemComboBox *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      *pSVar3 = FVar5.i;
      break;
    case 3:
      nameFilters((QFileSystemComboBox *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QList<QString>::operator=
                (in_stack_ffffffffffffff00,
                 (QList<QString> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QList<QString>::~QList((QList<QString> *)0x1d8b2e);
      break;
    case 4:
      SVar6 = visibleSection((QFileSystemComboBox *)0x1d8b40);
      *pSVar3 = SVar6;
      break;
    case 5:
      rootPath((QFileSystemComboBox *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
      ;
      QString::operator=((QString *)in_stack_ffffffffffffff00,
                         (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x1d8b7f);
      break;
    case 6:
      currentFileName(in_stack_ffffffffffffff38);
      QString::operator=((QString *)in_stack_ffffffffffffff00,
                         (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x1d8baf);
      break;
    case 7:
      currentFilePath(in_stack_ffffffffffffff38);
      QString::operator=((QString *)in_stack_ffffffffffffff00,
                         (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x1d8bdf);
    }
  }
  else if (in_ESI == 2) {
    pQVar7 = (QFileSystemComboBox *)(ulong)in_EDX;
    bVar4 = SUB41(in_stack_fffffffffffffefc >> 0x18,0);
    switch(pQVar7) {
    case (QFileSystemComboBox *)0x0:
      setNameFilterDisables(pQVar7,bVar4);
      break;
    case (QFileSystemComboBox *)0x1:
      setResolveSymlinks(pQVar7,bVar4);
      break;
    case (QFileSystemComboBox *)0x2:
      setFilters((QFileSystemComboBox *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),(Filters)0x0);
      break;
    case (QFileSystemComboBox *)0x3:
      setNameFilters(pQVar7,(QStringList *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      break;
    case (QFileSystemComboBox *)0x4:
      setVisibleSection(pQVar7,in_stack_fffffffffffffefc);
      break;
    case (QFileSystemComboBox *)0x5:
      setRootPath(in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      break;
    case (QFileSystemComboBox *)0x6:
      setCurrentFileName(in_stack_ffffffffffffff50,(QString *)in_stack_ffffffffffffff48);
      break;
    case (QFileSystemComboBox *)0x7:
      setCurrentFilePath(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void QFileSystemComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: { QString _r = _t->currentFileNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QString*>(_a[0]) = std::move(_r); }  break;
        case 3: { QString _r = _t->currentFilePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QString*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::directoryLoaded)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::rootPathChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = QString (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::currentFileNameChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = QString (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::currentFilePathChanged)) {
                *result = 3;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->nameFilterDisables(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->resolveSymlinks(); break;
        case 2: *reinterpret_cast< QDir::Filters*>(_v) = _t->filters(); break;
        case 3: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 4: *reinterpret_cast< QFileSystemComboBox::Section*>(_v) = _t->visibleSection(); break;
        case 5: *reinterpret_cast< QString*>(_v) = _t->rootPath(); break;
        case 6: *reinterpret_cast< QString*>(_v) = _t->currentFileName(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->currentFilePath(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFilterDisables(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setResolveSymlinks(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setFilters(*reinterpret_cast< QDir::Filters*>(_v)); break;
        case 3: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 4: _t->setVisibleSection(*reinterpret_cast< QFileSystemComboBox::Section*>(_v)); break;
        case 5: _t->setRootPath(*reinterpret_cast< QString*>(_v)); break;
        case 6: _t->setCurrentFileName(*reinterpret_cast< QString*>(_v)); break;
        case 7: _t->setCurrentFilePath(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}